

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stealth_strategy.cpp
# Opt level: O1

void __thiscall
StealthStrategy::generateActions(StealthStrategy *this,PlayerSight *sight,Actions *actions)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int *piVar4;
  Vec2 VVar5;
  bool bVar6;
  int iVar7;
  Randomizer *this_00;
  Router *this_01;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_b4;
  float local_b0;
  int local_ac;
  Vec2 local_98;
  
  if (this->field_0xc == '\0') {
    if (((sight->hp <= this->hp_lower_bound) && (sight->canSuckAttack == true)) &&
       (0 < sight->unitInSightCount)) {
      piVar8 = *(int **)&sight->unitInSight;
      piVar4 = *(int **)&sight->field_0x80;
      if (piVar8 == piVar4) {
        fVar12 = 1e+08;
        local_b0 = 0.0;
        local_98.x = 0.0;
        local_98.y = 0.0;
        local_ac = -1;
        bVar6 = false;
        local_b4 = 0.0;
        fVar16 = 1e+08;
        fVar18 = 1e+08;
        fVar17 = 1e+08;
      }
      else {
        local_ac = -1;
        local_98.x = 0.0;
        local_98.y = 0.0;
        fVar17 = 1e+08;
        bVar6 = false;
        fVar18 = 1e+08;
        fVar16 = 1e+08;
        fVar12 = 1e+08;
        local_b4 = 0.0;
        local_b0 = 0.0;
        do {
          fVar15 = ((Vec2 *)(piVar8 + 1))->x;
          fVar11 = (float)piVar8[2];
          VVar5 = *(Vec2 *)(piVar8 + 1);
          fVar1 = (float)piVar8[3];
          fVar2 = (float)piVar8[4];
          fVar10 = (sight->pos).x;
          fVar13 = (sight->pos).y;
          fVar14 = fVar17 - fVar10;
          fVar9 = fVar18 - fVar13;
          fVar10 = fVar15 - fVar10;
          fVar13 = fVar11 - fVar13;
          fVar10 = fVar10 * fVar10 + fVar13 * fVar13;
          if (fVar10 < fVar14 * fVar14 + fVar9 * fVar9) {
            fVar16 = fVar1;
            fVar17 = fVar15;
            fVar18 = fVar11;
            fVar12 = fVar2;
          }
          iVar3 = *piVar8;
          if (fVar10 < 0.0) {
            fVar10 = sqrtf(fVar10);
          }
          else {
            fVar10 = SQRT(fVar10);
          }
          if (fVar10 <= 4.0) {
            if (bVar6) {
              fVar10 = (sight->pos).x;
              fVar13 = (sight->pos).y;
              fVar9 = local_98.x - fVar10;
              fVar14 = local_98.y - fVar13;
              fVar15 = fVar15 - fVar10;
              fVar11 = fVar11 - fVar13;
              if (fVar15 * fVar15 + fVar11 * fVar11 <= fVar9 * fVar9 + fVar14 * fVar14)
              goto LAB_00105166;
            }
            else {
              bVar6 = true;
            }
            local_b4 = fVar1;
            local_b0 = fVar2;
            local_ac = iVar3;
            local_98 = VVar5;
          }
LAB_00105166:
          piVar8 = piVar8 + 5;
        } while (piVar8 != piVar4);
        local_b4 = local_b4 * 10.0;
        local_b0 = local_b0 * 10.0;
      }
      iVar3 = sight->unitInSightCount;
      if (iVar3 != 0) {
        if (bVar6) {
          Actions::emplace(actions,SuckAttack,local_ac,local_98);
          local_b4 = (sight->pos).x - local_b4;
          local_b0 = (sight->pos).y - local_b0;
        }
        else {
          local_b4 = fVar16 + fVar17;
          local_b0 = fVar12 + fVar18;
        }
        VVar5.y = local_b0;
        VVar5.x = local_b4;
        Actions::emplace(actions,SelectDestination,sight->id,VVar5);
        if (iVar3 != 0) {
          return;
        }
      }
    }
    fVar16 = 0.0 - (sight->velocity).x;
    fVar12 = 0.0 - (sight->velocity).y;
    if (fVar16 * fVar16 + fVar12 * fVar12 < 0.0001) {
      if (this->status == ssStandby) {
        if (this->activeRound <= sight->round) {
          this->status = ssWalking;
          this->activeRound = 0;
          iVar3 = sight->id;
          this_01 = Router::getInstance();
          VVar5 = Router::availablePosition(this_01);
          Actions::emplace(actions,SelectDestination,iVar3,VVar5);
          return;
        }
      }
      else if (this->status == ssWalking) {
        this->status = ssStandby;
        iVar3 = sight->round;
        this_00 = Randomizer::getInstance();
        iVar7 = Randomizer::randWaitTime(this_00);
        this->activeRound = iVar7 + iVar3;
      }
    }
  }
  return;
}

Assistant:

void StealthStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.hp <= hp_lower_bound && sight.canSuckAttack && sight.unitInSightCount > 0)
    {
        PUnitInfo nearest, choice;
        nearest.pos = Vec2(FINF, FINF);
        nearest.velocity = Vec2(FINF, FINF);
        bool found = false;
        for (auto uinfo : sight.unitInSight) {
            if ((nearest.pos - sight.pos).len2() > (uinfo.pos - sight.pos).len2())
                nearest = uinfo;
            if ((uinfo.pos - sight.pos).length() <= SuckRange) {
                if (!found) {
                    found = true;
                    choice = uinfo;
                } else if ((choice.pos - sight.pos).len2() < (uinfo.pos - sight.pos).len2())
                    choice = uinfo;
            }
        }

        if (sight.unitInSightCount != 0)
        {
            if (!found)
                actions->emplace(SelectDestination, sight.id, nearest.pos + nearest.velocity);
            else
            {
                actions->emplace(SuckAttack, choice.id, choice.pos);
                actions->emplace(SelectDestination, sight.id, sight.pos - (choice.velocity * 10.));
            }
            return;
        }
    }
    if (sight.velocity == Vec2())
    {
        if (status == ssWalking)    //开始等待
        {
            status = ssStandby;
            activeRound = sight.round + Randomizer::getInstance()->randWaitTime();
        }
        else if (status == ssStandby && sight.round >= activeRound)
        {
            status = ssWalking;
            activeRound = 0;
            actions->emplace(SelectDestination, sight.id, Router::getInstance()->availablePosition());
        }
    }
}